

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Clip_x86_avx::forward_inplace(Clip_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  _func_int **pp_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  int iVar6;
  _func_int *p_Var7;
  int _c;
  int iVar8;
  int iVar9;
  undefined1 (*pauVar10) [32];
  bool bVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  Mat local_78;
  
  iVar9 = bottom_top_blob->c;
  iVar8 = bottom_top_blob->h * bottom_top_blob->w;
  _c = 0;
  if (bottom_top_blob->elempack == 8) {
    if (iVar8 < 1) {
      iVar8 = _c;
    }
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    for (; _c != iVar9; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar10 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)this->_vptr_Clip_x86_avx[-3]);
      auVar14._4_4_ = uVar1;
      auVar14._0_4_ = uVar1;
      auVar14._8_4_ = uVar1;
      auVar14._12_4_ = uVar1;
      auVar14._16_4_ = uVar1;
      auVar14._20_4_ = uVar1;
      auVar14._24_4_ = uVar1;
      auVar14._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_Clip_x86_avx[-3]);
      auVar16._4_4_ = uVar1;
      auVar16._0_4_ = uVar1;
      auVar16._8_4_ = uVar1;
      auVar16._12_4_ = uVar1;
      auVar16._16_4_ = uVar1;
      auVar16._20_4_ = uVar1;
      auVar16._24_4_ = uVar1;
      auVar16._28_4_ = uVar1;
      iVar6 = iVar8;
      while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
        auVar5 = vmaxps_avx(auVar16,*pauVar10);
        auVar5 = vminps_avx(auVar5,auVar14);
        *pauVar10 = auVar5;
        pauVar10 = pauVar10 + 1;
      }
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (iVar8 < 1) {
      iVar8 = _c;
    }
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    for (; _c != iVar9; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar10 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)this->_vptr_Clip_x86_avx[-3]);
      auVar13._4_4_ = uVar1;
      auVar13._0_4_ = uVar1;
      auVar13._8_4_ = uVar1;
      auVar13._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_Clip_x86_avx[-3]);
      auVar15._4_4_ = uVar1;
      auVar15._0_4_ = uVar1;
      auVar15._8_4_ = uVar1;
      auVar15._12_4_ = uVar1;
      iVar6 = iVar8;
      while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
        auVar4 = vmaxps_avx(auVar15,*(undefined1 (*) [16])*pauVar10);
        auVar4 = vminps_avx(auVar4,auVar13);
        *(undefined1 (*) [16])*pauVar10 = auVar4;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
      }
    }
  }
  else {
    if (iVar9 < 1) {
      iVar9 = _c;
    }
    for (; _c != iVar9; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar10 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      pp_Var3 = this->_vptr_Clip_x86_avx;
      for (iVar6 = iVar8; 0 < iVar6; iVar6 = iVar6 + -1) {
        p_Var7 = pp_Var3[-3];
        fVar2 = *(float *)(&this->field_0xd0 + (long)p_Var7);
        fVar12 = *(float *)*pauVar10;
        if (*(float *)*pauVar10 < fVar2) {
          *(float *)*pauVar10 = fVar2;
          p_Var7 = pp_Var3[-3];
          fVar12 = fVar2;
        }
        if (*(float *)(&this->field_0xd4 + (long)p_Var7) < fVar12) {
          *(float *)*pauVar10 = *(float *)(&this->field_0xd4 + (long)p_Var7);
        }
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Clip_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _max = _mm256_set1_ps(max);
            __m256 _min = _mm256_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m256 _ptr = _mm256_loadu_ps(ptr);
                _ptr = _mm256_max_ps(_ptr, _min);
                _ptr = _mm256_min_ps(_ptr, _max);
                _mm256_storeu_ps(ptr, _ptr);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _max = _mm_set1_ps(max);
            __m128 _min = _mm_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m128 _ptr = _mm_loadu_ps(ptr);
                _ptr = _mm_max_ps(_ptr, _min);
                _ptr = _mm_min_ps(_ptr, _max);
                _mm_storeu_ps(ptr, _ptr);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int remain = size;
        for (; remain > 0; remain--)
        {
            if (*ptr < min)
                *ptr = min;

            if (*ptr > max)
                *ptr = max;

            ptr++;
        }
    }

    return 0;
}